

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

uint16_t * __thiscall
duckdb_snappy::internal::WorkingMemory::GetHashTable
          (WorkingMemory *this,size_t fragment_size,int *table_size)

{
  uint32_t uVar1;
  
  uVar1 = anon_unknown_3::CalculateTableSize((uint32_t)fragment_size);
  memset(this->table_,0,(ulong)uVar1 * 2);
  *table_size = uVar1;
  return this->table_;
}

Assistant:

uint16_t* WorkingMemory::GetHashTable(size_t fragment_size,
                                      int* table_size) const {
  const size_t htsize = CalculateTableSize(fragment_size);
  memset(table_, 0, htsize * sizeof(*table_));
  *table_size = htsize;
  return table_;
}